

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<long,(unsigned_char)2>>(Thread *this)

{
  Value VVar1;
  Value value;
  
  VVar1 = Pop(this);
  value.field_0._8_8_ = 0;
  value.field_0.i64_ = (VVar1.field_0._8_8_ >> 0x3f) * -2 - ((long)VVar1.field_0.i64_ >> 0x3f);
  Push(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}